

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O0

void ParsePrevouts(UniValue *prevTxsUnival,FlatSigningProvider *keystore,
                  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                  *coins)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last_01;
  string_view strKey;
  string_view strKey_00;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
  __l_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  __type_conflict _Var4;
  int iVar5;
  size_t sVar6;
  undefined8 uVar7;
  UniValue *pUVar8;
  string *message;
  long in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_CScriptID,_CScript>_>,_bool> pVar9;
  UniValue *ws;
  UniValue *rs;
  bool is_p2wsh;
  bool is_p2sh;
  int nOut;
  UniValue *prevOut;
  UniValue *p;
  uint idx;
  UniValue *prevTxs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> redeemScriptData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> scriptData;
  iterator coin;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pkData;
  CTxDestination p2wsh;
  CTxDestination p2sh_p2wsh;
  CTxDestination p2sh;
  CScript redeemScript;
  CScript witness_output_script;
  CScript script;
  Coin newcoin;
  string err;
  CScript scriptPubKey;
  COutPoint out;
  Txid txid;
  undefined4 in_stack_fffffffffffff518;
  uint32_t in_stack_fffffffffffff51c;
  UniValue *in_stack_fffffffffffff520;
  UniValue *in_stack_fffffffffffff528;
  undefined7 in_stack_fffffffffffff530;
  byte in_stack_fffffffffffff537;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff538;
  UniValue *in_stack_fffffffffffff540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff548;
  undefined6 in_stack_fffffffffffff550;
  byte in_stack_fffffffffffff556;
  byte in_stack_fffffffffffff557;
  string *in_stack_fffffffffffff558;
  allocator_type *in_stack_fffffffffffff560;
  char *__s;
  undefined4 in_stack_fffffffffffff568;
  int in_stack_fffffffffffff56c;
  UniValue *in_stack_fffffffffffff570;
  UniValue *in_stack_fffffffffffff578;
  UniValue *in_stack_fffffffffffff580;
  string *in_stack_fffffffffffff588;
  undefined5 in_stack_fffffffffffff590;
  undefined1 in_stack_fffffffffffff595;
  undefined1 in_stack_fffffffffffff596;
  undefined1 in_stack_fffffffffffff597;
  _Rb_tree_iterator<std::pair<const_CScriptID,_CScript>_> in_stack_fffffffffffff598;
  undefined1 *in_stack_fffffffffffff5a8;
  undefined2 uVar10;
  undefined7 in_stack_fffffffffffff5b0;
  undefined1 in_stack_fffffffffffff5b7;
  _Rb_tree_iterator<std::pair<const_CScriptID,_CScript>_> in_stack_fffffffffffff5b8;
  undefined1 *local_9a8;
  bool local_911;
  undefined1 *local_8a0;
  uint local_7ac;
  char local_781 [17];
  UniValue local_770;
  allocator<char> local_6ca;
  allocator<char> local_6c9;
  _Base_ptr local_6c8;
  _Base_ptr local_6c0;
  _Base_ptr local_648;
  undefined1 local_640;
  _Base_ptr local_638;
  undefined1 local_630;
  key_type local_5c8 [14];
  undefined1 local_3d0 [200];
  undefined1 local_308 [80];
  undefined1 local_2b8 [80];
  CAmount local_268;
  uint local_240;
  undefined1 local_d0 [120];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = UniValue::isNull((UniValue *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518)
                          );
  if (!bVar1) {
    UniValue::get_array(in_stack_fffffffffffff520);
    for (local_7ac = 0;
        sVar6 = UniValue::size((UniValue *)
                               CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518)),
        local_7ac < sVar6; local_7ac = local_7ac + 1) {
      UniValue::operator[]
                ((UniValue *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                 (size_t)in_stack_fffffffffffff528);
      bVar1 = UniValue::isObject((UniValue *)
                                 CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
      if (!bVar1) {
        uVar7 = __cxa_allocate_exception(0x58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                   (char *)in_stack_fffffffffffff560,(allocator<char> *)in_stack_fffffffffffff558);
        JSONRPCError(in_stack_fffffffffffff56c,in_stack_fffffffffffff558);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(uVar7,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00e414cb;
      }
      UniValue::get_obj(in_stack_fffffffffffff520);
      UniValueType::UniValueType
                ((UniValueType *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),VNULL
                );
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[5],_UniValueType,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                  *)CONCAT17(in_stack_fffffffffffff557,
                             CONCAT16(in_stack_fffffffffffff556,in_stack_fffffffffffff550)),
                 (char (*) [5])in_stack_fffffffffffff548,(UniValueType *)in_stack_fffffffffffff540);
      UniValueType::UniValueType
                ((UniValueType *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),VNULL
                );
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[5],_UniValueType,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                  *)CONCAT17(in_stack_fffffffffffff557,
                             CONCAT16(in_stack_fffffffffffff556,in_stack_fffffffffffff550)),
                 (char (*) [5])in_stack_fffffffffffff548,(UniValueType *)in_stack_fffffffffffff540);
      UniValueType::UniValueType
                ((UniValueType *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),VNULL
                );
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[13],_UniValueType,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                  *)CONCAT17(in_stack_fffffffffffff557,
                             CONCAT16(in_stack_fffffffffffff556,in_stack_fffffffffffff550)),
                 (char (*) [13])in_stack_fffffffffffff548,(UniValueType *)in_stack_fffffffffffff540)
      ;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
                   *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
      __l._M_len = (size_type)in_stack_fffffffffffff588;
      __l._M_array = (iterator)in_stack_fffffffffffff580;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
             *)in_stack_fffffffffffff570,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
            in_stack_fffffffffffff560);
      RPCTypeCheckObj((UniValue *)in_stack_fffffffffffff5b8._M_node,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                       *)CONCAT17(in_stack_fffffffffffff5b7,in_stack_fffffffffffff5b0),
                      SUB81((ulong)in_stack_fffffffffffff5a8 >> 0x38,0),
                      SUB81((ulong)in_stack_fffffffffffff5a8 >> 0x30,0));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
              *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
                    *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
      local_8a0 = local_58;
      do {
        local_8a0 = local_8a0 + -0x28;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                 *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
      } while (local_8a0 != local_d0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_fffffffffffff538._M_current,
                 (char *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
      strKey._M_len._6_1_ = in_stack_fffffffffffff556;
      strKey._M_len._0_6_ = in_stack_fffffffffffff550;
      strKey._M_len._7_1_ = in_stack_fffffffffffff557;
      strKey._M_str = (char *)in_stack_fffffffffffff558;
      ParseHashO(in_stack_fffffffffffff528,strKey);
      transaction_identifier<false>::FromUint256
                ((uint256 *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_fffffffffffff538._M_current,
                 (char *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
      key._M_str._0_4_ = in_stack_fffffffffffff568;
      key._M_len = (size_t)in_stack_fffffffffffff560;
      key._M_str._4_4_ = in_stack_fffffffffffff56c;
      UniValue::find_value(in_stack_fffffffffffff540,key);
      iVar5 = UniValue::getInt<int>(in_stack_fffffffffffff570);
      if (iVar5 < 0) {
        uVar7 = __cxa_allocate_exception(0x58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                   (char *)in_stack_fffffffffffff560,(allocator<char> *)in_stack_fffffffffffff558);
        JSONRPCError(in_stack_fffffffffffff56c,in_stack_fffffffffffff558);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(uVar7,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00e414cb;
      }
      COutPoint::COutPoint
                ((COutPoint *)in_stack_fffffffffffff528,(Txid *)in_stack_fffffffffffff520,
                 in_stack_fffffffffffff51c);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_fffffffffffff538._M_current,
                 (char *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
      strKey_00._M_len._6_1_ = in_stack_fffffffffffff556;
      strKey_00._M_len._0_6_ = in_stack_fffffffffffff550;
      strKey_00._M_len._7_1_ = in_stack_fffffffffffff557;
      strKey_00._M_str = (char *)in_stack_fffffffffffff558;
      ParseHexO(in_stack_fffffffffffff520,strKey_00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff520)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff520)
      ;
      last._M_current._7_1_ = in_stack_fffffffffffff537;
      last._M_current._0_7_ = in_stack_fffffffffffff530;
      CScript::
      CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ((CScript *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
                 in_stack_fffffffffffff538,last);
      local_6c0 = (_Base_ptr)
                  std::
                  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                  ::find((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                          *)in_stack_fffffffffffff520,
                         (key_type *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
      local_6c8 = (_Base_ptr)
                  std::
                  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                  ::end((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                         *)in_stack_fffffffffffff520);
      bVar1 = std::operator==((_Self *)in_stack_fffffffffffff528,(_Self *)in_stack_fffffffffffff520)
      ;
      local_911 = false;
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_> *)
                   CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        bVar1 = Coin::IsSpent((Coin *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518))
        ;
        local_911 = false;
        if (!bVar1) {
          std::_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_> *)
                     CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
          local_911 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator!=
                                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                 in_stack_fffffffffffff528,
                                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                 in_stack_fffffffffffff520);
        }
      }
      if (local_911 != false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                   (char *)in_stack_fffffffffffff560,(allocator<char> *)in_stack_fffffffffffff558);
        std::allocator<char>::~allocator(&local_6c9);
        std::_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_> *)
                   CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        ScriptToAsmStr_abi_cxx11_
                  ((CScript *)in_stack_fffffffffffff580,
                   SUB81((ulong)in_stack_fffffffffffff578 >> 0x38,0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff528);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                       (char *)in_stack_fffffffffffff528);
        ScriptToAsmStr_abi_cxx11_
                  ((CScript *)in_stack_fffffffffffff580,
                   SUB81((ulong)in_stack_fffffffffffff578 >> 0x38,0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff557,
                                CONCAT16(in_stack_fffffffffffff556,in_stack_fffffffffffff550)),
                       in_stack_fffffffffffff548);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff578,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff570);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        uVar7 = __cxa_allocate_exception(0x58);
        JSONRPCError(in_stack_fffffffffffff56c,in_stack_fffffffffffff558);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(uVar7,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00e414cb;
      }
      Coin::Coin((Coin *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
      CScript::operator=((CScript *)in_stack_fffffffffffff528,(CScript *)in_stack_fffffffffffff520);
      local_268 = 2100000000000000;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                 (char *)in_stack_fffffffffffff560,(allocator<char> *)in_stack_fffffffffffff558);
      bVar1 = UniValue::exists(in_stack_fffffffffffff520,
                               (string *)
                               CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
      std::allocator<char>::~allocator(&local_6ca);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   in_stack_fffffffffffff538._M_current,
                   (char *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
        key_00._M_str._0_4_ = in_stack_fffffffffffff568;
        key_00._M_len = (size_t)in_stack_fffffffffffff560;
        key_00._M_str._4_4_ = in_stack_fffffffffffff56c;
        UniValue::find_value(in_stack_fffffffffffff540,key_00);
        local_268 = AmountFromValue(in_stack_fffffffffffff580,
                                    (int)((ulong)in_stack_fffffffffffff578 >> 0x20));
      }
      local_240 = local_240 & 1 | 2;
      std::
      map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    *)in_stack_fffffffffffff540,(key_type *)in_stack_fffffffffffff538._M_current);
      Coin::operator=((Coin *)in_stack_fffffffffffff528,(Coin *)in_stack_fffffffffffff520);
      Coin::~Coin((Coin *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
      bVar1 = CScript::IsPayToScriptHash((CScript *)in_stack_fffffffffffff528);
      bVar2 = CScript::IsPayToWitnessScriptHash((CScript *)in_stack_fffffffffffff528);
      uVar10 = (undefined2)((ulong)in_stack_fffffffffffff5a8 >> 0x30);
      if ((in_RSI != 0) && ((bVar1 || (bVar2)))) {
        UniValueType::UniValueType
                  ((UniValueType *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
                   VNULL);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
        ::pair<const_char_(&)[13],_UniValueType,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                    *)CONCAT17(in_stack_fffffffffffff557,
                               CONCAT16(in_stack_fffffffffffff556,in_stack_fffffffffffff550)),
                   (char (*) [13])in_stack_fffffffffffff548,
                   (UniValueType *)in_stack_fffffffffffff540);
        UniValueType::UniValueType
                  ((UniValueType *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
                   VNULL);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
        ::pair<const_char_(&)[14],_UniValueType,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                    *)CONCAT17(in_stack_fffffffffffff557,
                               CONCAT16(in_stack_fffffffffffff556,in_stack_fffffffffffff550)),
                   (char (*) [14])in_stack_fffffffffffff548,
                   (UniValueType *)in_stack_fffffffffffff540);
        std::
        allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
        ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
                     *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        __l_00._M_len = (size_type)in_stack_fffffffffffff588;
        __l_00._M_array = (iterator)in_stack_fffffffffffff580;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
               *)in_stack_fffffffffffff570,__l_00,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
              in_stack_fffffffffffff560);
        RPCTypeCheckObj((UniValue *)in_stack_fffffffffffff5b8._M_node,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                         *)CONCAT17(in_stack_fffffffffffff5b7,in_stack_fffffffffffff5b0),
                        SUB21((ushort)uVar10 >> 8,0),SUB21(uVar10,0));
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        std::
        allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
        ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
                      *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        local_9a8 = local_2b8;
        do {
          local_9a8 = local_9a8 + -0x28;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                   *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        } while (local_9a8 != local_308);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   in_stack_fffffffffffff538._M_current,
                   (char *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
        key_01._M_str._0_4_ = in_stack_fffffffffffff568;
        key_01._M_len = (size_t)in_stack_fffffffffffff560;
        key_01._M_str._4_4_ = in_stack_fffffffffffff56c;
        pUVar8 = UniValue::find_value(in_stack_fffffffffffff540,key_01);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   in_stack_fffffffffffff538._M_current,
                   (char *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
        key_02._M_str._0_4_ = in_stack_fffffffffffff568;
        key_02._M_len = (size_t)in_stack_fffffffffffff560;
        key_02._M_str._4_4_ = in_stack_fffffffffffff56c;
        UniValue::find_value(in_stack_fffffffffffff540,key_02);
        bVar3 = UniValue::isNull((UniValue *)
                                 CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        if ((bVar3) &&
           (bVar3 = UniValue::isNull((UniValue *)
                                     CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518)),
           bVar3)) {
          uVar7 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                     (char *)in_stack_fffffffffffff560,(allocator<char> *)in_stack_fffffffffffff558)
          ;
          JSONRPCError(in_stack_fffffffffffff56c,in_stack_fffffffffffff558);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar7,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00e414cb;
        }
        bVar3 = UniValue::isNull((UniValue *)
                                 CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        if (bVar3) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     in_stack_fffffffffffff538._M_current,
                     (char *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
          name_00._M_len._5_1_ = in_stack_fffffffffffff595;
          name_00._M_len._0_5_ = in_stack_fffffffffffff590;
          name_00._M_len._6_1_ = in_stack_fffffffffffff596;
          name_00._M_len._7_1_ = in_stack_fffffffffffff597;
          name_00._M_str = (char *)in_stack_fffffffffffff598._M_node;
          ParseHexV(in_stack_fffffffffffff580,name_00);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     in_stack_fffffffffffff538._M_current,
                     (char *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
          name._M_len._5_1_ = in_stack_fffffffffffff595;
          name._M_len._0_5_ = in_stack_fffffffffffff590;
          name._M_len._6_1_ = in_stack_fffffffffffff596;
          name._M_len._7_1_ = in_stack_fffffffffffff597;
          name._M_str = (char *)in_stack_fffffffffffff598._M_node;
          ParseHexV(in_stack_fffffffffffff580,name);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff520);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff520);
        last_00._M_current._7_1_ = in_stack_fffffffffffff537;
        last_00._M_current._0_7_ = in_stack_fffffffffffff530;
        CScript::
        CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((CScript *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
                   in_stack_fffffffffffff538,last_00);
        CScriptID::CScriptID
                  ((CScriptID *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                   (CScript *)in_stack_fffffffffffff528);
        pVar9 = std::
                map<CScriptID,CScript,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                ::emplace<CScriptID,CScript&>
                          ((map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                            *)in_stack_fffffffffffff538._M_current,
                           (CScriptID *)
                           CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                           (CScript *)in_stack_fffffffffffff528);
        in_stack_fffffffffffff5b8 = pVar9.first._M_node;
        in_stack_fffffffffffff5b7 = pVar9.second;
        local_638 = in_stack_fffffffffffff5b8._M_node;
        local_630 = in_stack_fffffffffffff5b7;
        WitnessV0ScriptHash::WitnessV0ScriptHash
                  ((WitnessV0ScriptHash *)in_stack_fffffffffffff540,
                   (CScript *)in_stack_fffffffffffff538._M_current);
        in_stack_fffffffffffff5a8 = local_3d0;
        std::
        variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
        ::variant<WitnessV0ScriptHash,void,void,WitnessV0ScriptHash,void>
                  ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)in_stack_fffffffffffff528,(WitnessV0ScriptHash *)in_stack_fffffffffffff520);
        GetScriptForDestination
                  ((CTxDestination *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        CScriptID::CScriptID
                  ((CScriptID *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                   (CScript *)in_stack_fffffffffffff528);
        pVar9 = std::
                map<CScriptID,CScript,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                ::emplace<CScriptID,CScript&>
                          ((map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                            *)in_stack_fffffffffffff538._M_current,
                           (CScriptID *)
                           CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                           (CScript *)in_stack_fffffffffffff528);
        in_stack_fffffffffffff598 = pVar9.first._M_node;
        in_stack_fffffffffffff597 = pVar9.second;
        local_648 = in_stack_fffffffffffff598._M_node;
        local_640 = in_stack_fffffffffffff597;
        in_stack_fffffffffffff596 =
             UniValue::isNull((UniValue *)
                              CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        if ((!(bool)in_stack_fffffffffffff596) &&
           (in_stack_fffffffffffff595 =
                 UniValue::isNull((UniValue *)
                                  CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518)),
           !(bool)in_stack_fffffffffffff595)) {
          in_stack_fffffffffffff588 = UniValue::get_str_abi_cxx11_(in_stack_fffffffffffff520);
          in_stack_fffffffffffff580 =
               (UniValue *)UniValue::get_str_abi_cxx11_(in_stack_fffffffffffff520);
          _Var4 = std::operator==(in_stack_fffffffffffff548,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff540);
          if (((_Var4 ^ 0xffU) & 1) != 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       in_stack_fffffffffffff538._M_current,
                       (char *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
            name_01._M_len._5_1_ = in_stack_fffffffffffff595;
            name_01._M_len._0_5_ = in_stack_fffffffffffff590;
            name_01._M_len._6_1_ = in_stack_fffffffffffff596;
            name_01._M_len._7_1_ = in_stack_fffffffffffff597;
            name_01._M_str = (char *)in_stack_fffffffffffff598._M_node;
            ParseHexV(in_stack_fffffffffffff580,name_01);
            in_stack_fffffffffffff570 = &local_770;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff520);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff520);
            last_01._M_current._7_1_ = in_stack_fffffffffffff537;
            last_01._M_current._0_7_ = in_stack_fffffffffffff530;
            CScript::
            CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ((CScript *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
                       in_stack_fffffffffffff538,last_01);
            bVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator!=
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                               in_stack_fffffffffffff528,
                               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                               in_stack_fffffffffffff520);
            in_stack_fffffffffffff56c = CONCAT13(bVar3,(int3)in_stack_fffffffffffff56c);
            if (bVar3) {
              message = (string *)__cxa_allocate_exception(0x58);
              __s = local_781;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),__s,
                         (allocator<char> *)message);
              JSONRPCError(in_stack_fffffffffffff56c,message);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                __cxa_throw(message,&UniValue::typeinfo,UniValue::~UniValue);
              }
              goto LAB_00e414cb;
            }
            CScript::~CScript((CScript *)
                              CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff528);
            in_stack_fffffffffffff578 = pUVar8;
          }
        }
        if (bVar1) {
          ScriptHash::ScriptHash
                    ((ScriptHash *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                     (CScript *)in_stack_fffffffffffff528);
          std::
          variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
          ::variant<ScriptHash,void,void,ScriptHash,void>
                    ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)in_stack_fffffffffffff528,(ScriptHash *)in_stack_fffffffffffff520);
          ScriptHash::ScriptHash
                    ((ScriptHash *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                     (CScript *)in_stack_fffffffffffff528);
          std::
          variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
          ::variant<ScriptHash,void,void,ScriptHash,void>
                    ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)in_stack_fffffffffffff528,(ScriptHash *)in_stack_fffffffffffff520);
          GetScriptForDestination
                    ((CTxDestination *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518)
                    );
          in_stack_fffffffffffff557 =
               prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                          (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          in_stack_fffffffffffff528);
          CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518)
                           );
          if ((in_stack_fffffffffffff557 & 1) == 0) {
            GetScriptForDestination
                      ((CTxDestination *)
                       CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
            in_stack_fffffffffffff556 =
                 prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                           ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                            CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                            (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                            in_stack_fffffffffffff528);
            CScript::~CScript((CScript *)
                              CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
            if ((in_stack_fffffffffffff556 & 1) == 0) {
              uVar7 = __cxa_allocate_exception(0x58);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                         (char *)in_stack_fffffffffffff560,
                         (allocator<char> *)in_stack_fffffffffffff558);
              JSONRPCError(in_stack_fffffffffffff56c,in_stack_fffffffffffff558);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                __cxa_throw(uVar7,&UniValue::typeinfo,UniValue::~UniValue);
              }
              goto LAB_00e414cb;
            }
          }
          std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
          std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        }
        else if (bVar2) {
          WitnessV0ScriptHash::WitnessV0ScriptHash
                    ((WitnessV0ScriptHash *)in_stack_fffffffffffff540,
                     (CScript *)in_stack_fffffffffffff538._M_current);
          in_stack_fffffffffffff538._M_current = (uchar *)local_5c8;
          std::
          variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
          ::variant<WitnessV0ScriptHash,void,void,WitnessV0ScriptHash,void>
                    ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)in_stack_fffffffffffff528,(WitnessV0ScriptHash *)in_stack_fffffffffffff520);
          GetScriptForDestination
                    ((CTxDestination *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518)
                    );
          in_stack_fffffffffffff537 =
               prevector<28U,_unsigned_char,_unsigned_int,_int>::operator!=
                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          in_stack_fffffffffffff528,
                          (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          in_stack_fffffffffffff520);
          CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518)
                           );
          if ((in_stack_fffffffffffff537 & 1) != 0) {
            uVar7 = __cxa_allocate_exception(0x58);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                       (char *)in_stack_fffffffffffff560,
                       (allocator<char> *)in_stack_fffffffffffff558);
            JSONRPCError(in_stack_fffffffffffff56c,in_stack_fffffffffffff558);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              __cxa_throw(uVar7,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_00e414cb;
          }
          std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        }
        CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff528);
      }
      CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff528)
      ;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_00e414cb:
  __stack_chk_fail();
}

Assistant:

void ParsePrevouts(const UniValue& prevTxsUnival, FlatSigningProvider* keystore, std::map<COutPoint, Coin>& coins)
{
    if (!prevTxsUnival.isNull()) {
        const UniValue& prevTxs = prevTxsUnival.get_array();
        for (unsigned int idx = 0; idx < prevTxs.size(); ++idx) {
            const UniValue& p = prevTxs[idx];
            if (!p.isObject()) {
                throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "expected object with {\"txid'\",\"vout\",\"scriptPubKey\"}");
            }

            const UniValue& prevOut = p.get_obj();

            RPCTypeCheckObj(prevOut,
                {
                    {"txid", UniValueType(UniValue::VSTR)},
                    {"vout", UniValueType(UniValue::VNUM)},
                    {"scriptPubKey", UniValueType(UniValue::VSTR)},
                });

            Txid txid = Txid::FromUint256(ParseHashO(prevOut, "txid"));

            int nOut = prevOut.find_value("vout").getInt<int>();
            if (nOut < 0) {
                throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "vout cannot be negative");
            }

            COutPoint out(txid, nOut);
            std::vector<unsigned char> pkData(ParseHexO(prevOut, "scriptPubKey"));
            CScript scriptPubKey(pkData.begin(), pkData.end());

            {
                auto coin = coins.find(out);
                if (coin != coins.end() && !coin->second.IsSpent() && coin->second.out.scriptPubKey != scriptPubKey) {
                    std::string err("Previous output scriptPubKey mismatch:\n");
                    err = err + ScriptToAsmStr(coin->second.out.scriptPubKey) + "\nvs:\n"+
                        ScriptToAsmStr(scriptPubKey);
                    throw JSONRPCError(RPC_DESERIALIZATION_ERROR, err);
                }
                Coin newcoin;
                newcoin.out.scriptPubKey = scriptPubKey;
                newcoin.out.nValue = MAX_MONEY;
                if (prevOut.exists("amount")) {
                    newcoin.out.nValue = AmountFromValue(prevOut.find_value("amount"));
                }
                newcoin.nHeight = 1;
                coins[out] = std::move(newcoin);
            }

            // if redeemScript and private keys were given, add redeemScript to the keystore so it can be signed
            const bool is_p2sh = scriptPubKey.IsPayToScriptHash();
            const bool is_p2wsh = scriptPubKey.IsPayToWitnessScriptHash();
            if (keystore && (is_p2sh || is_p2wsh)) {
                RPCTypeCheckObj(prevOut,
                    {
                        {"redeemScript", UniValueType(UniValue::VSTR)},
                        {"witnessScript", UniValueType(UniValue::VSTR)},
                    }, true);
                const UniValue& rs{prevOut.find_value("redeemScript")};
                const UniValue& ws{prevOut.find_value("witnessScript")};
                if (rs.isNull() && ws.isNull()) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, "Missing redeemScript/witnessScript");
                }

                // work from witnessScript when possible
                std::vector<unsigned char> scriptData(!ws.isNull() ? ParseHexV(ws, "witnessScript") : ParseHexV(rs, "redeemScript"));
                CScript script(scriptData.begin(), scriptData.end());
                keystore->scripts.emplace(CScriptID(script), script);
                // Automatically also add the P2WSH wrapped version of the script (to deal with P2SH-P2WSH).
                // This is done for redeemScript only for compatibility, it is encouraged to use the explicit witnessScript field instead.
                CScript witness_output_script{GetScriptForDestination(WitnessV0ScriptHash(script))};
                keystore->scripts.emplace(CScriptID(witness_output_script), witness_output_script);

                if (!ws.isNull() && !rs.isNull()) {
                    // if both witnessScript and redeemScript are provided,
                    // they should either be the same (for backwards compat),
                    // or the redeemScript should be the encoded form of
                    // the witnessScript (ie, for p2sh-p2wsh)
                    if (ws.get_str() != rs.get_str()) {
                        std::vector<unsigned char> redeemScriptData(ParseHexV(rs, "redeemScript"));
                        CScript redeemScript(redeemScriptData.begin(), redeemScriptData.end());
                        if (redeemScript != witness_output_script) {
                            throw JSONRPCError(RPC_INVALID_PARAMETER, "redeemScript does not correspond to witnessScript");
                        }
                    }
                }

                if (is_p2sh) {
                    const CTxDestination p2sh{ScriptHash(script)};
                    const CTxDestination p2sh_p2wsh{ScriptHash(witness_output_script)};
                    if (scriptPubKey == GetScriptForDestination(p2sh)) {
                        // traditional p2sh; arguably an error if
                        // we got here with rs.IsNull(), because
                        // that means the p2sh script was specified
                        // via witnessScript param, but for now
                        // we'll just quietly accept it
                    } else if (scriptPubKey == GetScriptForDestination(p2sh_p2wsh)) {
                        // p2wsh encoded as p2sh; ideally the witness
                        // script was specified in the witnessScript
                        // param, but also support specifying it via
                        // redeemScript param for backwards compat
                        // (in which case ws.IsNull() == true)
                    } else {
                        // otherwise, can't generate scriptPubKey from
                        // either script, so we got unusable parameters
                        throw JSONRPCError(RPC_INVALID_PARAMETER, "redeemScript/witnessScript does not match scriptPubKey");
                    }
                } else if (is_p2wsh) {
                    // plain p2wsh; could throw an error if script
                    // was specified by redeemScript rather than
                    // witnessScript (ie, ws.IsNull() == true), but
                    // accept it for backwards compat
                    const CTxDestination p2wsh{WitnessV0ScriptHash(script)};
                    if (scriptPubKey != GetScriptForDestination(p2wsh)) {
                        throw JSONRPCError(RPC_INVALID_PARAMETER, "redeemScript/witnessScript does not match scriptPubKey");
                    }
                }
            }
        }
    }
}